

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# epoll_kqueue.c
# Opt level: O2

void us_loop_run(us_loop_t *loop)

{
  uint uVar1;
  us_poll_t *p;
  int iVar2;
  int iVar3;
  uint uVar4;
  uint uVar5;
  
  us_loop_integrate(loop);
  while (loop->num_polls != 0) {
    us_internal_loop_pre(loop);
    iVar2 = epoll_wait(loop->fd,(epoll_event *)loop->ready_polls,0x400,-1);
    loop->num_ready_polls = iVar2;
    for (iVar3 = 0; loop->current_ready_poll = iVar3, iVar3 < iVar2; iVar3 = iVar3 + 1) {
      p = (us_poll_t *)loop->ready_polls[iVar3].data.ptr;
      if (p != (us_poll_t *)0x0) {
        uVar1 = loop->ready_polls[iVar3].events;
        uVar5 = -((int)p->state >> 0x1f);
        uVar4 = (uint)p->state >> 0x1c & 4;
        if ((uVar4 + uVar5 + 0x18 & uVar1) != 0) {
          us_internal_dispatch_ready_poll(p,uVar1 & 0x18,(uVar4 | uVar5) & uVar1);
          iVar2 = loop->num_ready_polls;
          iVar3 = loop->current_ready_poll;
        }
      }
    }
    us_internal_loop_post(loop);
  }
  return;
}

Assistant:

void us_loop_run(struct us_loop_t *loop) {
    us_loop_integrate(loop);

    /* While we have non-fallthrough polls we shouldn't fall through */
    while (loop->num_polls) {
        /* Emit pre callback */
        us_internal_loop_pre(loop);

        /* Fetch ready polls */
#ifdef LIBUS_USE_EPOLL
        loop->num_ready_polls = epoll_wait(loop->fd, loop->ready_polls, 1024, -1);
#else
        loop->num_ready_polls = kevent(loop->fd, NULL, 0, loop->ready_polls, 1024, NULL);
#endif

        /* Iterate ready polls, dispatching them by type */
        for (loop->current_ready_poll = 0; loop->current_ready_poll < loop->num_ready_polls; loop->current_ready_poll++) {
            struct us_poll_t *poll = GET_READY_POLL(loop, loop->current_ready_poll);
            /* Any ready poll marked with nullptr will be ignored */
            if (poll) {
#ifdef LIBUS_USE_EPOLL
                int events = loop->ready_polls[loop->current_ready_poll].events;
                int error = loop->ready_polls[loop->current_ready_poll].events & (EPOLLERR | EPOLLHUP);
#else
                /* EVFILT_READ, EVFILT_TIME, EVFILT_USER are all mapped to LIBUS_SOCKET_READABLE */
                int events = LIBUS_SOCKET_READABLE;
                if (loop->ready_polls[loop->current_ready_poll].filter == EVFILT_WRITE) {
                    events = LIBUS_SOCKET_WRITABLE;
                }
                int error = loop->ready_polls[loop->current_ready_poll].flags & (EV_ERROR | EV_EOF);
#endif
                /* Always filter all polls by what they actually poll for (callback polls always poll for readable) */
                events &= us_poll_events(poll);
                if (events || error) {
                    us_internal_dispatch_ready_poll(poll, error, events);
                }
            }
        }
        /* Emit post callback */
        us_internal_loop_post(loop);
    }
}